

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error FT_Attach_Stream(FT_Face face,FT_Open_Args *parameters)

{
  FT_Driver pFVar1;
  bool bVar2;
  FT_Driver_Class clazz;
  FT_Driver driver;
  FT_Stream pFStack_28;
  FT_Error error;
  FT_Stream stream;
  FT_Open_Args *parameters_local;
  FT_Face face_local;
  
  if (face == (FT_Face)0x0) {
    face_local._4_4_ = 0x23;
  }
  else {
    pFVar1 = face->driver;
    if (pFVar1 == (FT_Driver)0x0) {
      face_local._4_4_ = 0x22;
    }
    else {
      stream = (FT_Stream)parameters;
      parameters_local = (FT_Open_Args *)face;
      driver._4_4_ = FT_Stream_New((pFVar1->root).library,parameters,&stack0xffffffffffffffd8);
      if (driver._4_4_ == 0) {
        driver._4_4_ = 7;
        if (pFVar1->clazz->attach_file != (FT_Face_AttachFunc)0x0) {
          driver._4_4_ = (*pFVar1->clazz->attach_file)((FT_Face)parameters_local,pFStack_28);
        }
        bVar2 = false;
        if ((stream->pathname).value != 0) {
          bVar2 = ((ulong)stream->base & 2) != 0;
        }
        FT_Stream_Free(pFStack_28,(uint)bVar2);
      }
      face_local._4_4_ = driver._4_4_;
    }
  }
  return face_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Attach_Stream( FT_Face              face,
                    const FT_Open_Args*  parameters )
  {
    FT_Stream  stream;
    FT_Error   error;
    FT_Driver  driver;

    FT_Driver_Class  clazz;


    /* test for valid `parameters' delayed to `FT_Stream_New' */

    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    driver = face->driver;
    if ( !driver )
      return FT_THROW( Invalid_Driver_Handle );

    error = FT_Stream_New( driver->root.library, parameters, &stream );
    if ( error )
      goto Exit;

    /* we implement FT_Attach_Stream in each driver through the */
    /* `attach_file' interface                                  */

    error = FT_ERR( Unimplemented_Feature );
    clazz = driver->clazz;
    if ( clazz->attach_file )
      error = clazz->attach_file( face, stream );

    /* close the attached stream */
    FT_Stream_Free( stream,
                    FT_BOOL( parameters->stream                     &&
                             ( parameters->flags & FT_OPEN_STREAM ) ) );

  Exit:
    return error;
  }